

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dic_compiler.cpp
# Opt level: O0

void dic_insert_word(char *word,uint value)

{
  size_t sVar1;
  uint in_ESI;
  char *in_RDI;
  size_t out_sz;
  MAFSA_letter out [1024];
  size_t local_420;
  MAFSA_letter local_418 [192];
  size_t in_stack_fffffffffffffca8;
  MAFSA_letter *in_stack_fffffffffffffcb0;
  daciuk<29> *in_stack_fffffffffffffcb8;
  uint local_c;
  
  sVar1 = SIMPLE_conv_string_to_letters(in_RDI,local_418,0x400);
  local_418[sVar1] = '\x1d';
  for (local_c = in_ESI; local_420 = sVar1 + 1, local_c != 0; local_c = local_c / 0x1d) {
    local_418[sVar1 + 1] = (MAFSA_letter)((ulong)local_c % 0x1d);
    sVar1 = local_420;
  }
  MAFSA::daciuk<29>::insert
            (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  return;
}

Assistant:

void dic_insert_word(const char *word, unsigned int value)
{
	MAFSA_letter out [MAX_OUT];
	size_t out_sz;

	out_sz = SIMPLE_conv_string_to_letters(word, out, MAX_OUT);
	out[out_sz++] = SIMPLE_LETTER_DELIM;

	while (value)
	{
		out[out_sz++] = value % SIMPLE_LETTER_DELIM;
		value /= SIMPLE_LETTER_DELIM;
	}

	dict.insert(out, out_sz);
}